

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-iosim.c
# Opt level: O3

int main(int argc,char **argv)

{
  char acVar1 [8];
  char **ppcVar2;
  int iVar3;
  int iVar4;
  void *buf;
  FILE *__stream;
  int *piVar5;
  ulong uVar6;
  void *pvVar7;
  char *pcVar8;
  ulong uVar9;
  void *pvVar10;
  size_t bytes;
  ulong uVar11;
  int iVar12;
  undefined8 *puVar13;
  long lVar14;
  void *pvVar15;
  long lVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  char local_1908 [8];
  char buffer [1500];
  char local_908 [1504];
  undefined1 local_328 [8];
  BigArray array;
  undefined1 auStack_f8 [8];
  BigBlock bb;
  BigBlockPtr ptr;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  double local_68;
  char **local_58;
  char **argv_local;
  BigFile BStack_48;
  int argc_local;
  BigFile bf;
  
  local_58 = argv;
  argv_local._4_4_ = argc;
  MPI_Init((long)&argv_local + 4,&local_58);
  MPI_Comm_rank(&ompi_mpi_comm_world,&ThisTask);
  MPI_Comm_size(&ompi_mpi_comm_world,&NTask);
LAB_001036e0:
  do {
    iVar3 = getopt(argv_local._4_4_,local_58,getoptstr);
    ppcVar2 = local_58;
    iVar4 = _optind;
    if (iVar3 < 0x6e) {
      piVar5 = &aggregated;
      if (iVar3 == 0x41) goto LAB_00103771;
      if (iVar3 != 0x66) {
        if ((iVar3 == -1) && (lVar16 = (long)_optind, _optind != argv_local._4_4_)) {
          pcVar8 = strdup(local_58[lVar16]);
          mode = 0;
          lVar14 = 0;
          iVar3 = 1;
          goto LAB_001037bf;
        }
        break;
      }
      pcVar8 = "%d";
      piVar5 = &Nfile;
    }
    else {
      switch(iVar3) {
      case 0x6e:
        pcVar8 = "%d";
        piVar5 = &Nwriter;
        break;
      default:
        goto switchD_0010370b_caseD_6f;
      case 0x70:
        piVar5 = &purge;
LAB_00103771:
        *piVar5 = 1;
        goto LAB_001036e0;
      case 0x73:
        pcVar8 = "%td";
        piVar5 = (int *)&size;
        break;
      case 0x77:
        pcVar8 = "%d";
        piVar5 = &nmemb;
      }
    }
    iVar4 = __isoc99_sscanf(_optarg,pcVar8,piVar5);
  } while (iVar4 == 1);
  goto switchD_0010370b_caseD_6f;
  while( true ) {
    lVar14 = lVar14 + 8;
    iVar3 = iVar12 + 1;
    mode = iVar12;
    if (lVar14 == 0x20) break;
LAB_001037bf:
    iVar12 = iVar3;
    iVar3 = strcmp(*(char **)((long)MODES + lVar14),pcVar8);
    if (iVar3 == 0) {
      _optind = iVar4 + 1;
      strcpy(local_908,ppcVar2[lVar16 + 1]);
      if (Nwriter == 0 || NTask < Nwriter) {
        info("############## CAUTION: you chose %d ranks and %d writers! ##############\n #  If you want %d writers, allocate at least %d ranks with <mpirun -n %d> #\n ################### Can only use %d writers instead! ###################\n"
             ,(ulong)(uint)NTask,(ulong)(uint)Nwriter,(ulong)(uint)Nwriter,(ulong)(uint)Nwriter,
             (ulong)(uint)Nwriter,(ulong)(uint)NTask);
        Nwriter = NTask;
      }
      if (Nfile == 0) {
        Nfile = Nwriter;
      }
      if (aggregated == 0) {
        bytes = 0;
      }
      else {
        bytes = (long)nmemb * size * 8;
      }
      big_file_mpi_set_aggregated_threshold(bytes);
      BStack_48.basename = (char *)0x0;
      bb.Nfile = 0;
      bb._60_4_ = 0;
      bb.attrset = (BigAttrSet *)0x0;
      bb.foffset = (size_t *)0x0;
      bb.fchecksum = (uint *)0x0;
      bb.size = 0;
      bb.fsize = (size_t *)0x0;
      bb.nmemb = 0;
      bb._12_4_ = 0;
      bb.basename = (char *)0x0;
      auStack_f8[0] = '\0';
      auStack_f8[1] = '\0';
      auStack_f8[2] = '\0';
      auStack_f8[3] = '\0';
      auStack_f8[4] = '\0';
      auStack_f8[5] = '\0';
      auStack_f8[6] = '\0';
      auStack_f8[7] = '\0';
      bb.dtype[0] = '\0';
      bb.dtype[1] = '\0';
      bb.dtype[2] = '\0';
      bb.dtype[3] = '\0';
      bb.dtype[4] = '\0';
      bb.dtype[5] = '\0';
      bb.dtype[6] = '\0';
      bb.dtype[7] = '\0';
      memset(local_328,0,0x220);
      bb.dirty = 0;
      bb._76_4_ = 0;
      info("iosim.c: started.\n");
      big_file_mpi_set_verbose(1);
      local_68 = 0.0;
      local_78 = 0.0;
      dStack_70 = 0.0;
      local_88 = 0.0;
      dStack_80 = 0.0;
      if (mode - 1U < 2) {
        info("Opening BigFile\n");
        dVar17 = (double)MPI_Wtime();
        iVar4 = big_file_mpi_open(&stack0xffffffffffffffb8,local_908,(MPI_Comm)&ompi_mpi_comm_world)
        ;
        if (iVar4 != 0) {
LAB_00103b29:
          pcVar8 = big_file_get_error_message();
          puts(pcVar8);
          goto LAB_00104185;
        }
        dVar18 = (double)MPI_Wtime();
        pcVar8 = (char *)0x0;
        info("Opened BigFile\n");
        info("Opening BigBlock\n");
        bf.basename = (char *)MPI_Wtime();
        big_file_mpi_open_block
                  (&stack0xffffffffffffffb8,(BigBlock *)auStack_f8,"TestBlock",
                   (MPI_Comm)&ompi_mpi_comm_world);
        dVar19 = (double)MPI_Wtime();
        dStack_80 = (dVar19 - (double)bf.basename) + (dVar18 - dVar17) + 0.0;
        info("Opened BigBlock\n");
        acVar1 = bb.dtype;
        size = (size_t)bb.basename;
        nmemb._0_1_ = bb.dtype[0];
        nmemb._1_1_ = bb.dtype[1];
        nmemb._2_1_ = bb.dtype[2];
        nmemb._3_1_ = bb.dtype[3];
        Nfile = (int)bb.fchecksum;
        bb.dtype = acVar1;
      }
      else if (mode == 3) {
        info("Growing BigFile\n");
        dVar17 = (double)MPI_Wtime();
        iVar4 = big_file_mpi_open(&stack0xffffffffffffffb8,local_908,(MPI_Comm)&ompi_mpi_comm_world)
        ;
        if (iVar4 != 0) goto LAB_00103b29;
        dVar18 = (double)MPI_Wtime();
        info("Opened BigFile\n");
        info("Opening BigBlock\n");
        bf.basename = (char *)MPI_Wtime();
        big_file_mpi_open_block
                  (&stack0xffffffffffffffb8,(BigBlock *)auStack_f8,"TestBlock",
                   (MPI_Comm)&ompi_mpi_comm_world);
        pcVar8 = bb.basename;
        big_block_mpi_grow_simple((BigBlock *)auStack_f8,Nfile,size,(MPI_Comm)&ompi_mpi_comm_world);
        dVar19 = (double)MPI_Wtime();
        dStack_80 = (dVar19 - (double)bf.basename) + (dVar18 - dVar17) + 0.0;
        info("Opened BigBlock\n");
        acVar1 = bb.dtype;
        nmemb._0_1_ = bb.dtype[0];
        nmemb._1_1_ = bb.dtype[1];
        nmemb._2_1_ = bb.dtype[2];
        nmemb._3_1_ = bb.dtype[3];
        bb.dtype = acVar1;
      }
      else {
        if (mode != 0) {
LAB_001041d9:
          abort();
        }
        pcVar8 = (char *)0x0;
        info("Creating BigFile\n");
        dVar17 = (double)MPI_Wtime();
        big_file_mpi_create(&stack0xffffffffffffffb8,local_908,(MPI_Comm)&ompi_mpi_comm_world);
        dVar18 = (double)MPI_Wtime();
        info("Created BigFile\n");
        info("Creating BigBlock\n");
        bf.basename = (char *)MPI_Wtime();
        big_file_mpi_create_block
                  (&stack0xffffffffffffffb8,(BigBlock *)auStack_f8,"TestBlock","i8",nmemb,Nfile,size
                   ,(MPI_Comm)&ompi_mpi_comm_world);
        dVar19 = (double)MPI_Wtime();
        local_88 = (dVar19 - (double)bf.basename) + (dVar18 - dVar17) + 0.0;
        info("Created BigBlock\n");
      }
      big_block_seek((BigBlock *)auStack_f8,(BigBlockPtr *)&bb.dirty,(ptrdiff_t)pcVar8);
      uVar9 = (ulong)ThisTask;
      if ((uVar9 & 1) == 0) {
        uVar11 = (ulong)NTask;
        uVar9 = (uVar9 * size) / uVar11;
        iVar4 = ThisTask + 2;
        if (NTask <= ThisTask + 2) {
          iVar4 = NTask;
        }
        uVar6 = ((long)iVar4 * size) % uVar11;
        pvVar15 = (void *)(((long)iVar4 * size) / uVar11 - uVar9);
      }
      else {
        uVar6 = size * (uVar9 - 1);
        pvVar15 = (void *)0x0;
        uVar9 = uVar6 / (ulong)(long)NTask;
        uVar6 = uVar6 % (ulong)(long)NTask;
      }
      info("Writing to `%s`\n",local_908,uVar6);
      info("mode %s\n",MODES[mode]);
      info("nmemb %d\n",(ulong)(uint)nmemb);
      info("Size %td\n",size);
      info("NBlobFiles %td\n",(ulong)(uint)Nfile);
      info("BytesPerBlob %td\n",(ulong)(uint)Nfile);
      info("Ranks %d\n",(ulong)(uint)NTask);
      info("Writers %d\n",(ulong)(uint)Nwriter);
      info("Aggregated %d\n",(ulong)(uint)aggregated);
      info("LocalBytes %td\n",(long)nmemb * (long)pvVar15 * 8);
      info("LocalSize %td\n",pvVar15);
      buf = malloc((long)pvVar15 * 8 * (long)nmemb);
      array.data = pvVar15;
      big_array_init((BigArray *)local_328,buf,"i8",2,(size_t *)&array.data,(ptrdiff_t *)0x0);
      if (mode - 2U < 2) {
LAB_00103da8:
        info("Initializing FakeData\n");
        iVar4 = nmemb;
        if (pvVar15 != (void *)0x0) {
          uVar6 = (ulong)(uint)nmemb;
          lVar16 = (long)nmemb;
          pvVar7 = (void *)0x0;
          pvVar10 = buf;
          do {
            if (0 < iVar4) {
              uVar11 = 0;
              do {
                *(ulong *)((long)pvVar10 + uVar11 * 8) = (long)pvVar7 + uVar9;
                uVar11 = uVar11 + 1;
              } while (uVar6 != uVar11);
            }
            pvVar7 = (void *)((long)pvVar7 + 1);
            pvVar10 = (void *)((long)pvVar10 + lVar16 * 8);
          } while (pvVar7 != pvVar15);
        }
        info("Initialized FakeData\n");
        info("Writing BigBlock\n");
        dVar17 = (double)MPI_Wtime();
        iVar4 = big_block_mpi_write((BigBlock *)auStack_f8,(BigBlockPtr *)&bb.dirty,
                                    (BigArray *)local_328,Nwriter,(MPI_Comm)&ompi_mpi_comm_world);
        if (iVar4 != 0) {
          pcVar8 = big_file_get_error_message();
          info("Error occured: %s\n",pcVar8);
        }
        dVar18 = (double)MPI_Wtime();
        dVar17 = (dVar18 - dVar17) + 0.0;
        local_78 = dVar17;
        info("Written BigBlock\n");
        info("Writing took %f seconds\n",dVar17);
      }
      else if (mode == 1) {
        info("Reading BigBlock\n");
        dVar17 = (double)MPI_Wtime();
        iVar4 = big_block_mpi_read((BigBlock *)auStack_f8,(BigBlockPtr *)&bb.dirty,
                                   (BigArray *)local_328,Nwriter,(MPI_Comm)&ompi_mpi_comm_world);
        if (iVar4 != 0) {
          pcVar8 = big_file_get_error_message();
          info("Error occured: %s\n",pcVar8);
        }
        dVar18 = (double)MPI_Wtime();
        dStack_70 = (dVar18 - dVar17) + 0.0;
        info("Reading took %f seconds\n");
        info("Initializing FakeData\n");
        if (pvVar15 != (void *)0x0) {
          pvVar7 = (void *)0x0;
          pvVar10 = buf;
          do {
            if (0 < nmemb) {
              uVar6 = 0;
              do {
                if (*(long *)((long)pvVar10 + uVar6 * 8) != (long)pvVar7 + uVar9) {
                  info("data is corrupted either due to reading or writing\n");
                  goto LAB_001041d9;
                }
                uVar6 = uVar6 + 1;
              } while ((uint)nmemb != uVar6);
            }
            pvVar7 = (void *)((long)pvVar7 + 1);
            pvVar10 = (void *)((long)pvVar10 + (long)nmemb * 8);
          } while (pvVar7 != pvVar15);
        }
        info("Initialized FakeData\n");
      }
      else if (mode == 0) goto LAB_00103da8;
      info("Closing BigBlock\n");
      dVar17 = (double)MPI_Wtime();
      big_block_mpi_close((BigBlock *)auStack_f8,(MPI_Comm)&ompi_mpi_comm_world);
      dVar18 = (double)MPI_Wtime();
      info("Closed BigBlock\n");
      info("Closing BigFile\n");
      bf.basename = (char *)MPI_Wtime();
      big_file_mpi_close(&stack0xffffffffffffffb8,(MPI_Comm)&ompi_mpi_comm_world);
      dVar19 = (double)MPI_Wtime();
      local_68 = (dVar19 - (double)bf.basename) + (dVar18 - dVar17) + 0.0;
      info("Closed BigFile\n");
      free(buf);
      pvVar15 = malloc((long)NTask * 0x28);
      MPI_Gather(&local_88,0x28,&ompi_mpi_byte,pvVar15,0x28,&ompi_mpi_byte,0,&ompi_mpi_comm_world);
      if (ThisTask == 0) {
        sprintf(local_1908,"%s/%s-timelog",local_908,MODES[mode]);
        __stream = fopen(local_1908,"a+");
        if (__stream == (FILE *)0x0) {
          info("iosim.c: Couldn\'t open file %s for writting!\n",local_1908);
        }
        else {
          fprintf(__stream,"# mode\tNfile\tranks\twriters\titems\tnmemb\n%s\t%d\t%d\t%d\t%td\t%d\n",
                  MODES[mode],(ulong)(uint)Nfile,(ulong)(uint)NTask,(ulong)(uint)Nwriter,size,
                  (ulong)(uint)nmemb);
          fwrite("# Task\tTcreate\t\tTopen\t\tTwrite\t\tTread\t\tTclose\n",0x2d,1,__stream);
          if (0 < NTask) {
            puVar13 = (undefined8 *)((long)pvVar15 + 0x20);
            lVar16 = 0;
            do {
              fprintf(__stream,"%04td\t%012.8f\t%012.8f\t%012.8f\t%012.8f\t%012.8f\n",puVar13[-4],
                      puVar13[-3],puVar13[-2],puVar13[-1],*puVar13,lVar16);
              lVar16 = lVar16 + 1;
              puVar13 = puVar13 + 5;
            } while (lVar16 < NTask);
          }
        }
        fclose(__stream);
      }
      free(pvVar15);
LAB_00104185:
      if ((purge != 0) && (ThisTask == 0)) {
        sprintf(local_1908,"rm -rf %s/TestBlock",local_908);
        system(local_1908);
      }
      goto LAB_001037ee;
    }
  }
switchD_0010370b_caseD_6f:
  usage();
LAB_001037ee:
  MPI_Finalize();
  return 0;
}

Assistant:

int main(int argc, char * argv[]) {
    MPI_Init(&argc, &argv);
    
    MPI_Comm_rank(MPI_COMM_WORLD, &ThisTask);
    MPI_Comm_size(MPI_COMM_WORLD, &NTask);
    
    int i;
    int ch;
    char * filename = alloca(1500);
    
    while(-1 != (ch = getopt(argc, argv, getoptstr))) {
        switch(ch) {
            case 'A':
                aggregated = 1;
                break;
            case 'p':
                purge = 1;
                break;
            case 'w':
                if(1 != sscanf(optarg, "%d", &nmemb)) {
                    usage();
                    goto byebye;
                }
                break;
            case 'f':
                if(1 != sscanf(optarg, "%d", &Nfile)) {
                    usage();
                    goto byebye;
                }
                break;
            case 'n':
                if(1 != sscanf(optarg, "%d", &Nwriter)) {
                    usage();
                    goto byebye;
                }
                break;
            case 's':
                if(1 != sscanf(optarg, "%td", &size)) {
                    usage();
                    goto byebye;
                }
                break;
            case 'h':
            default:
                usage();
                goto byebye;
        }    
    }
    if(optind == argc) {
        usage();
        goto byebye;
    }

    char * smode = strdup(argv[optind]);
    for(mode = 0; mode < 4; mode ++) {
        if(0 == strcmp(MODES[mode], smode)) break;
    }
    if(mode == 4) {
        usage(); goto byebye;
    }

    optind++;

    sprintf(filename, "%s", argv[optind]);

    if (Nwriter > NTask || Nwriter == 0) {
        info("############## CAUTION: you chose %d ranks and %d writers! ##############\n"
             " #  If you want %d writers, allocate at least %d ranks with <mpirun -n %d> #\n"
             " ################### Can only use %d writers instead! ###################\n",
             NTask, Nwriter, Nwriter, Nwriter, Nwriter, NTask);
        Nwriter = NTask;
    }
    if (Nfile == 0) {
        Nfile = Nwriter;
    }

    iosim(filename);

    if (purge) {
        if(ThisTask == 0) {
            char buffer[1500];
            sprintf(buffer, "rm -rf %s/TestBlock", filename);
            system(buffer);
        }
    }
//+++++++++++++++++ Writing Time Log +++++++++++++++++
byebye:
    MPI_Finalize();
    return 0;
}